

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FieldDescriptor * __thiscall
google::protobuf::FileDescriptor::FindExtensionByName(FileDescriptor *this,string *key)

{
  __node_ptr p_Var1;
  FieldDescriptor *pFVar2;
  char *pcVar3;
  __hash_code __c;
  long lVar4;
  FieldDescriptor *pFVar5;
  char cVar6;
  bool bVar7;
  key_type local_18;
  
  local_18.second = (key->_M_dataplus)._M_p;
  cVar6 = *local_18.second;
  if (cVar6 == '\0') {
    lVar4 = 0;
  }
  else {
    lVar4 = 0;
    pcVar3 = local_18.second;
    do {
      pcVar3 = pcVar3 + 1;
      lVar4 = (long)cVar6 + lVar4 * 5;
      cVar6 = *pcVar3;
    } while (cVar6 != '\0');
  }
  __c = (long)this * 0xffff + lVar4;
  pFVar5 = (FieldDescriptor *)0x0;
  local_18.first = this;
  p_Var1 = std::
           _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(*(_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            **)(this + 0xa8),
                          __c % (*(_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                   **)(this + 0xa8))->_M_bucket_count,&local_18,__c);
  if (p_Var1 == (__node_ptr)0x0) {
    bVar7 = false;
  }
  else {
    pFVar5 = *(FieldDescriptor **)
              ((long)&(p_Var1->
                      super__Hash_node_value<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_true>
                      ).
                      super__Hash_node_value_base<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>
                      ._M_storage._M_storage + 0x18);
    bVar7 = *(int *)((long)&(p_Var1->
                            super__Hash_node_value<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>
                            ._M_storage._M_storage + 0x10) == 2;
  }
  if (bVar7) {
    pFVar2 = (FieldDescriptor *)0x0;
    if (pFVar5[0x50] != (FieldDescriptor)0x0) {
      pFVar2 = pFVar5;
    }
  }
  else {
    pFVar2 = (FieldDescriptor *)0x0;
  }
  return pFVar2;
}

Assistant:

const FieldDescriptor*
FileDescriptor::FindExtensionByName(const string& key) const {
  Symbol result = tables_->FindNestedSymbolOfType(this, key, Symbol::FIELD);
  if (!result.IsNull() && result.field_descriptor->is_extension()) {
    return result.field_descriptor;
  } else {
    return NULL;
  }
}